

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector2D.cpp
# Opt level: O2

ostream * CGL::operator<<(ostream *os,Vector2D *v)

{
  ostream *poVar1;
  
  std::operator<<(os,"(");
  poVar1 = std::ostream::_M_insert<double>(v->x);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(v->y);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const Vector2D& v ) {
    os << "(" << v.x << "," << v.y << ")";
    return os;
  }